

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskBuilder.cpp
# Opt level: O1

vector<FormatType_*,_std::allocator<FormatType_*>_> * __thiscall
DiskBuilder::GetFormatsList
          (vector<FormatType_*,_std::allocator<FormatType_*>_> *__return_storage_ptr__,
          DiskBuilder *this,FormatAction action)

{
  pointer *pppFVar1;
  iterator __position;
  char cVar2;
  long lVar3;
  pointer __args;
  
  (__return_storage_ptr__->super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args = (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (__args != (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (action == READ) {
        lVar3 = 0x18;
LAB_00130d7b:
        cVar2 = (**(code **)((long)(*__args)->_vptr_FormatType + lVar3))();
        if (cVar2 != '\0') {
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<FormatType*,std::allocator<FormatType*>>::
            _M_realloc_insert<FormatType*const&>
                      ((vector<FormatType*,std::allocator<FormatType*>> *)__return_storage_ptr__,
                       __position,__args);
          }
          else {
            *__position._M_current = *__args;
            pppFVar1 = &(__return_storage_ptr__->
                        super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppFVar1 = *pppFVar1 + 1;
          }
        }
      }
      else if (action == WRITE) {
        lVar3 = 0x20;
        goto LAB_00130d7b;
      }
      __args = __args + 1;
    } while (__args != (this->format_list_).
                       super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<FormatType*> DiskBuilder::GetFormatsList(DiskBuilder::FormatAction action)
{
   std::vector<FormatType*> format_list;

   for (auto it = format_list_.begin(); it != format_list_.end(); it++)
   {
      bool add = false;
      switch (action)
      {
      case READ:
         add = (*it)->CanLoad();
         break;
      case WRITE:
         add = (*it)->CanSave();
         break;
      }
      if (add)
      {
         format_list.push_back(*it);
      }
   }
   return format_list;
}